

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd_cgap.h
# Opt level: O3

void __thiscall
bwtil::bsd_cgap::build
          (bsd_cgap *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *gaps,bool last,
          cgap_dictionary *D)

{
  map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  *this_00;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  pointer puVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  byte bVar8;
  unsigned_long uVar9;
  word_type value;
  undefined7 in_register_00000011;
  long lVar10;
  long lVar11;
  uint uVar12;
  pointer puVar13;
  ulong uVar14;
  ulong uVar15;
  bitview<std::vector> *pbVar16;
  word_type value_00;
  unsigned_long local_90;
  packed_view<std::vector> local_88;
  bitview<std::vector> *local_58;
  cgap_dictionary *local_50;
  packed_view<std::vector> *local_48;
  packed_view<std::vector> *local_40;
  long local_38;
  
  this->W = '@';
  this->D = D;
  puVar5 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = (long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar5 >> 3;
  if ((int)CONCAT71(in_register_00000011,last) == 0) {
    uVar9 = puVar5[uVar15 - 1];
    uVar6 = uVar15 - 1;
  }
  else {
    uVar9 = 0;
    uVar6 = uVar15;
  }
  this->tail = uVar9;
  this->n = uVar6;
  this->u = uVar9;
  uVar14 = (CONCAT71(in_register_00000011,last) ^ 1) & 0xff;
  if (uVar15 != uVar14) {
    lVar10 = 0;
    do {
      uVar9 = uVar9 + puVar5[lVar10];
      lVar10 = lVar10 + 1;
      this->u = uVar9;
    } while (uVar15 - uVar14 != lVar10);
  }
  lVar10 = -uVar14;
  bVar8 = 1;
  if (uVar9 != 0) {
    bVar8 = 0x40 - (char)LZCOUNT(uVar9);
  }
  this->logu = bVar8;
  uVar3 = (uint)bVar8 * 5;
  this->t = uVar3;
  sVar4 = (uVar6 / uVar3 + 1) - (ulong)(uVar6 % (ulong)uVar3 == 0);
  this->number_of_blocks = sVar4;
  local_50 = D;
  bv::internal::packed_view<std::vector>::packed_view(&local_88,(ulong)(uint)bVar8,sVar4);
  puVar5 = (this->first_el)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->first_el)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88._bits._container.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->first_el)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_88._bits._container.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  (this->first_el)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar5 == (pointer)0x0) {
    (this->first_el)._field_mask = local_88._field_mask;
    (this->first_el)._size = CONCAT44(local_88._size._4_4_,(uint)local_88._size);
    (this->first_el)._width = local_88._width;
  }
  else {
    operator_delete(puVar5);
    (this->first_el)._field_mask = local_88._field_mask;
    (this->first_el)._size = CONCAT44(local_88._size._4_4_,(uint)local_88._size);
    (this->first_el)._width = local_88._width;
    if (local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88._bits._container.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  this->c = 0;
  pbVar16 = (bitview<std::vector> *)(ulong)((uint)lVar10 & 1);
  puVar13 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  puVar5 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((bitview<std::vector> *)((long)puVar13 - (long)puVar5 >> 3) == pbVar16) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    this_00 = &local_50->encoding;
    local_58 = pbVar16;
    do {
      if (uVar15 % (ulong)this->t != 0) {
        local_90 = puVar5[uVar15];
        pmVar7 = std::
                 map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                 ::operator[](this_00,&local_90);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)&local_88,pmVar7);
        this->c = (ulong)(uint)local_88._size + this->c +
                  ((long)local_88._bits._container.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage -
                  (long)local_88._bits._container.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start) * 8;
        if (local_88._bits._container.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88._bits._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        puVar5 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar13 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)(((long)puVar13 - (long)puVar5 >> 3) + lVar10));
    uVar15 = this->c;
    pbVar16 = local_58;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
             ((uVar15 >> 6) + 1) - (ulong)((uVar15 & 0x3f) == 0),(allocator_type *)&local_90);
  puVar5 = (this->C)._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->C)._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->C)._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  (this->C)._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5);
    if (local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88._bits._container.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  bVar8 = 1;
  if (this->c != 0) {
    bVar8 = 0x40 - (char)LZCOUNT(this->c);
  }
  this->logc = bVar8;
  bv::internal::packed_view<std::vector>::packed_view(&local_88,(ulong)bVar8,this->number_of_blocks)
  ;
  puVar5 = (this->C_addr)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->C_addr)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->C_addr)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  (this->C_addr)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar5 == (pointer)0x0) {
    (this->C_addr)._field_mask = local_88._field_mask;
    (this->C_addr)._size = CONCAT44(local_88._size._4_4_,(uint)local_88._size);
    (this->C_addr)._width = local_88._width;
  }
  else {
    operator_delete(puVar5);
    (this->C_addr)._field_mask = local_88._field_mask;
    (this->C_addr)._size = CONCAT44(local_88._size._4_4_,(uint)local_88._size);
    (this->C_addr)._width = local_88._width;
    if (local_88._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88._bits._container.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  puVar5 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((bitview<std::vector> *)
      ((long)(gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)puVar5 >> 3) != pbVar16) {
    local_50 = (cgap_dictionary *)&local_50->encoding;
    local_40 = &this->first_el;
    uVar15 = 0;
    value_00 = 0;
    lVar11 = 0;
    local_58 = &this->C;
    local_48 = &this->C_addr;
    local_38 = lVar10;
    do {
      uVar6 = uVar15 / this->t;
      lVar11 = lVar11 + puVar5[uVar15];
      if (uVar15 % (ulong)this->t == 0) {
        sVar4 = (this->first_el)._width;
        bv::internal::bitview<std::vector>::set
                  (&local_40->_bits,sVar4 * uVar6,(uVar6 + 1) * sVar4,lVar11 - 1);
        uVar6 = uVar15 / this->t;
        sVar4 = (this->C_addr)._width;
        bv::internal::bitview<std::vector>::set
                  (&local_48->_bits,sVar4 * uVar6,(uVar6 + 1) * sVar4,value_00);
      }
      else {
        local_90 = puVar5[uVar15];
        pmVar7 = std::
                 map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                 ::operator[]((map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                               *)local_50,&local_90);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)&local_88,pmVar7);
        uVar6 = (ulong)(uint)local_88._size +
                ((long)local_88._bits._container.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage -
                (long)local_88._bits._container.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start) * 8;
        uVar3 = (uint)uVar6;
        if (uVar3 == 0) {
          value = 0;
        }
        else {
          uVar14 = 0;
          value = 0;
          do {
            uVar2 = uVar14 >> 6;
            uVar1 = uVar14 & 0x3f;
            uVar12 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar12;
            value = (ulong)((uint)(local_88._bits._container.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar2] >> uVar1) & 1) +
                    value * 2;
          } while (uVar12 < uVar3);
        }
        uVar6 = uVar6 & 0xffffffff;
        sVar4 = this->c - value_00;
        bv::internal::bitview<std::vector>::set(local_58,sVar4 - uVar6,sVar4,value);
        if (local_88._bits._container.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88._bits._container.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        value_00 = value_00 + uVar6;
        lVar10 = local_38;
      }
      puVar5 = (gaps->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)(((long)(gaps->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3
                              ) + lVar10));
  }
  return;
}

Assistant:

void build(vector<ulint> &gaps,bool last, cgap_dictionary * D){

		assert(gaps.size()>0);

		W = sizeof(ulint)*8;

		this->D=D;
		if(last) last=1;

		if(last){

			tail=0;
			n=gaps.size();

		}else{

			tail=gaps[gaps.size()-1];
			n=gaps.size()-1;

		}

		//cout << "n = " << (ulint)n<<endl;

		u = tail;

		//count bits and ones
		for(ulint i=0;i<(gaps.size()-1)+last;++i)
			u+=gaps[i];

		assert(u>0);

		//cout << "u = " << (ulint)u<<endl;

		logu = intlog2(u);

		//compute block size
		t = 5*logu;
		if(t<2) t = 2;

		number_of_blocks = n/t + (n%t!=0);
		first_el = packed_view<vector>(logu,number_of_blocks);

		c=0;

		//count number of bits in C
		for(ulint i=0;i<(gaps.size()-1)+last;++i){

			if(i%t!=0)
				c+=D->encode(gaps[i]).size();

		}

		C = bitview<vector>(c);
		logc = intlog2(c);

		//cout << "log c = " << (ulint)logc<<endl;
		//cout << "log u = " << (ulint)logu<<endl;
		//cout << "t = " << (ulint)t<<endl;

		C_addr = packed_view<vector>(logc,number_of_blocks);

		ulint cumulative_u = 0;
		ulint cumulative_c = 0;

		for(ulint i=0;i<(gaps.size()-1)+last;++i){

			cumulative_u+=gaps[i];

			if(i%t==0){

				assert(cumulative_u>0);
				assert(cumulative_u-1<(ulint(1)<<logu));
				assert(cumulative_c<(ulint(1)<<logc));

				first_el[i/t] = cumulative_u-1;
				C_addr[i/t] = cumulative_c;

			}else{

				auto code = D->encode(gaps[i]);
				uint l = code.size();

				ulint code_ul=0;

				for(uint j=0;j<l;j++)
					code_ul = code_ul*2+code[j];

				assert(code_ul<(ulint(1)<<l));

				//transform to access correctly C:
				//interval [i,i+l) -> [(c-i)-l,c-i)

				assert(c>=(cumulative_c+l));
				ulint left = (c - cumulative_c)-l;
				ulint right = c - cumulative_c;

				C(left,right) = code_ul;

				cumulative_c+=l;

			}

		}

		//cout << "c = " << (ulint)c<<endl;

		/*cout << "first el : "<<endl;
		for(auto i : first_el)
			cout << i << endl;*/

	}